

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_textedit_init_fixed(nk_text_edit *state,void *memory,nk_size size)

{
  ulong uVar1;
  ulong uVar2;
  nk_text_edit *__s;
  
  if (state == (nk_text_edit *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x3633,"void nk_textedit_init_fixed(struct nk_text_edit *, void *, nk_size)");
  }
  if (memory != (void *)0x0) {
    if (size != 0) {
      uVar1 = (ulong)state & 3;
      if (uVar1 == 0) {
        uVar2 = 0x1508;
        __s = state;
      }
      else {
        memset(state,0,4 - uVar1);
        uVar2 = uVar1 | 0x1504;
        __s = (nk_text_edit *)((4 - uVar1) + (long)state);
      }
      uVar1 = (ulong)((uint)uVar2 & 0xfffffffc);
      memset(__s,0,uVar1);
      if ((uVar2 & 3) != 0) {
        memset((void *)((long)(__s->string).buffer.marker + (uVar1 - 0x18)),0,uVar2 & 3);
      }
      (state->undo).undo_point = 0;
      (state->undo).redo_point = 99;
      (state->undo).undo_char_point = 0;
      (state->undo).redo_char_point = 999;
      state->cursor = 0;
      state->select_start = 0;
      state->select_end = 0;
      state->mode = '\0';
      state->cursor_at_end_of_line = '\0';
      state->initialized = '\x01';
      state->has_preferred_x = '\0';
      state->preferred_x = 0.0;
      state->single_line = '\x01';
      state->filter = (nk_plugin_filter)0x0;
      (state->scrollbar).x = 0.0;
      (state->scrollbar).y = 0.0;
      nk_buffer_init_fixed(&(state->string).buffer,memory,size);
      (state->string).len = 0;
    }
    return;
  }
  __assert_fail("memory",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x3634,"void nk_textedit_init_fixed(struct nk_text_edit *, void *, nk_size)");
}

Assistant:

NK_API void
nk_textedit_init_fixed(struct nk_text_edit *state, void *memory, nk_size size)
{
    NK_ASSERT(state);
    NK_ASSERT(memory);
    if (!state || !memory || !size) return;
    NK_MEMSET(state, 0, sizeof(struct nk_text_edit));
    nk_textedit_clear_state(state, NK_TEXT_EDIT_SINGLE_LINE, 0);
    nk_str_init_fixed(&state->string, memory, size);
}